

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

void TTD::NSSnapValues::ExtractSnapPrimitiveValue
               (SnapPrimitiveValue *snapValue,RecyclableObject *jsValue,bool isWellKnown,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *idToTypeMap,
               SlabAllocator *alloc)

{
  PropertyId PVar1;
  charcount_t length;
  Entry *pEVar2;
  TTD_WELLKNOWN_TOKEN str;
  char16 *pcVar3;
  JavascriptBoolean *pJVar4;
  JavascriptTypedNumber<unsigned_long> *pJVar5;
  TTString *pTVar6;
  JavascriptString *pJVar7;
  undefined7 in_register_00000011;
  double dVar8;
  
  snapValue->PrimitiveValueId = (TTD_PTR_ID)jsValue;
  pEVar2 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::FindSlotForId<false>
                     (idToTypeMap,(unsigned_long)(jsValue->type).ptr);
  snapValue->SnapType = pEVar2->Data;
  if ((int)CONCAT71(in_register_00000011,isWellKnown) == 0) {
    str = (char16 *)0x0;
  }
  else {
    str = RuntimeContextInfo::ResolvePathForKnownObject
                    (((((((jsValue->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase
                      ).scriptContext.ptr)->TTDWellKnownInfo,jsValue);
  }
  pcVar3 = SlabAllocatorBase<0>::CopyRawNullTerminatedStringInto(alloc,str);
  snapValue->OptWellKnownToken = pcVar3;
  if (pcVar3 != (char16 *)0x0) {
    return;
  }
  switch(snapValue->SnapType->JsTypeId) {
  case TypeIds_Undefined:
  case TypeIds_Null:
    goto switchD_00859669_caseD_0;
  case TypeIds_Boolean:
    pJVar4 = Js::VarTo<Js::JavascriptBoolean,Js::RecyclableObject>(jsValue);
    PVar1 = pJVar4->value;
    break;
  default:
    TTDAbort_unrecoverable_error
              (
              "These are supposed to be primitive values on the heap e.g., no pointers or properties."
              );
  case TypeIds_Number:
    dVar8 = Js::JavascriptNumber::GetValue(jsValue);
    (snapValue->field_3).u_doubleValue = dVar8;
    return;
  case TypeIds_Int64Number:
    pJVar5 = (JavascriptTypedNumber<unsigned_long> *)
             Js::VarTo<Js::JavascriptTypedNumber<long>,Js::RecyclableObject>(jsValue);
    goto LAB_0085968a;
  case TypeIds_LastNumberType:
    pJVar5 = Js::VarTo<Js::JavascriptTypedNumber<unsigned_long>,Js::RecyclableObject>(jsValue);
LAB_0085968a:
    snapValue->field_3 = (anon_union_8_6_090a279e_for_SnapPrimitiveValue_3)pJVar5->m_value;
    return;
  case TypeIds_String:
    pTVar6 = (TTString *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
    (snapValue->field_3).u_stringValue = pTVar6;
    pJVar7 = Js::VarTo<Js::JavascriptString,Js::RecyclableObject>(jsValue);
    pcVar3 = Js::JavascriptString::GetString(pJVar7);
    pJVar7 = Js::VarTo<Js::JavascriptString,Js::RecyclableObject>(jsValue);
    length = Js::JavascriptString::GetLength(pJVar7);
    SlabAllocatorBase<0>::CopyStringIntoWLength
              (alloc,pcVar3,length,(snapValue->field_3).u_stringValue);
    return;
  case TypeIds_Symbol:
    PVar1 = Js::JavascriptLibrary::ExtractPrimitveSymbolId_TTD
                      ((((jsValue->type).ptr)->javascriptLibrary).ptr,jsValue);
  }
  (snapValue->field_3).u_propertyIdValue = PVar1;
switchD_00859669_caseD_0:
  return;
}

Assistant:

void ExtractSnapPrimitiveValue(SnapPrimitiveValue* snapValue, Js::RecyclableObject* jsValue, bool isWellKnown, const TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapType*>& idToTypeMap, SlabAllocator& alloc)
        {
            snapValue->PrimitiveValueId = TTD_CONVERT_VAR_TO_PTR_ID(jsValue);

            Js::Type* objType = jsValue->GetType();
            snapValue->SnapType = idToTypeMap.LookupKnownItem(TTD_CONVERT_TYPEINFO_TO_PTR_ID(objType));

            TTD_WELLKNOWN_TOKEN lookupToken = isWellKnown ? jsValue->GetScriptContext()->TTDWellKnownInfo->ResolvePathForKnownObject(jsValue) : TTD_INVALID_WELLKNOWN_TOKEN;
            snapValue->OptWellKnownToken = alloc.CopyRawNullTerminatedStringInto(lookupToken);

            if(snapValue->OptWellKnownToken == TTD_INVALID_WELLKNOWN_TOKEN)
            {
                Js::JavascriptLibrary* jslib = jsValue->GetLibrary();

                switch(snapValue->SnapType->JsTypeId)
                {
                case Js::TypeIds_Undefined:
                case Js::TypeIds_Null:
                    break;
                case Js::TypeIds_Boolean:
                    snapValue->u_boolValue = Js::VarTo<Js::JavascriptBoolean>(jsValue)->GetValue();
                    break;
                case Js::TypeIds_Number:
                    snapValue->u_doubleValue = Js::JavascriptNumber::GetValue(jsValue);
                    break;
                case Js::TypeIds_Int64Number:
                    snapValue->u_int64Value = Js::VarTo<Js::JavascriptInt64Number>(jsValue)->GetValue();
                    break;
                case Js::TypeIds_UInt64Number:
                    snapValue->u_uint64Value = Js::VarTo<Js::JavascriptUInt64Number>(jsValue)->GetValue();
                    break;
                case Js::TypeIds_String:
                    snapValue->u_stringValue = alloc.SlabAllocateStruct<TTString>();
                    alloc.CopyStringIntoWLength(Js::VarTo<Js::JavascriptString>(jsValue)->GetString(), Js::VarTo<Js::JavascriptString>(jsValue)->GetLength(), *(snapValue->u_stringValue));
                    break;
                case Js::TypeIds_Symbol:
                    snapValue->u_propertyIdValue = jslib->ExtractPrimitveSymbolId_TTD(jsValue);
                    break;
                default:
                    TTDAssert(false, "These are supposed to be primitive values on the heap e.g., no pointers or properties.");
                    break;
                }
            }
        }